

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void GET_BLOCK(Integer g_x,task_list_t *chunk,void *buf,char *trans,Integer xilo,Integer xjlo,
              Integer *dim_next,Integer *nbhdl)

{
  int *piVar1;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  if ((byte)(*trans | 0x20U) == 0x6e) {
    *dim_next = (long)chunk->dim[0];
    local_18 = chunk->lo[0] + xilo;
    local_28 = chunk->hi[0] + xilo;
    local_10 = chunk->lo[1] + xjlo;
    piVar1 = chunk->hi + 1;
  }
  else {
    *dim_next = (long)chunk->dim[1];
    local_18 = chunk->lo[1] + xjlo;
    piVar1 = chunk->hi;
    local_28 = chunk->hi[1] + xjlo;
    local_10 = chunk->lo[0] + xilo;
    xjlo = xilo;
  }
  local_20 = *piVar1 + xjlo;
  pnga_nbget(g_x,&local_18,&local_28,buf,dim_next,nbhdl);
  return;
}

Assistant:

static void GET_BLOCK(Integer g_x, task_list_t *chunk, void *buf, 
		      char *trans, Integer xilo, Integer xjlo, 
		      Integer *dim_next, Integer *nbhdl) {

    Integer i0, i1, j0, j1;
    Integer lo[2], hi[2];

    if(*trans == 'n' || *trans == 'N') {
       *dim_next = chunk->dim[0];
       i0= xilo+chunk->lo[0]; i1= xilo+chunk->hi[0];
       j0= xjlo+chunk->lo[1]; j1= xjlo+chunk->hi[1];
    }
    else {
       *dim_next = chunk->dim[1];
       i0= xjlo+chunk->lo[1]; i1= xjlo+chunk->hi[1];
       j0= xilo+chunk->lo[0]; j1= xilo+chunk->hi[0];
    }

    lo[0] = i0;
    lo[1] = j0;
    hi[0] = i1;
    hi[1] = j1;
    pnga_nbget(g_x, lo, hi, buf, dim_next, nbhdl);
}